

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

void __thiscall MeCab::anon_unknown_0::LatticeImpl::LatticeImpl(LatticeImpl *this,Writer *writer)

{
  Allocator<mecab_node_t,_mecab_path_t> *this_00;
  
  (this->super_Lattice)._vptr_Lattice = (_func_int **)&PTR_clear_001396f0;
  this->sentence_ = (char *)0x0;
  this->size_ = 0;
  this->theta_ = 0.75;
  this->Z_ = 0.0;
  this->request_type_ = 1;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->writer_ = writer;
  (this->ostrs_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00139918;
  (this->ostrs_).ptr_ = (StringBuffer *)0x0;
  this_00 = (Allocator<mecab_node_t,_mecab_path_t> *)operator_new(0x78);
  Allocator<mecab_node_t,_mecab_path_t>::Allocator(this_00);
  (this->allocator_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00139a98;
  (this->allocator_).ptr_ = this_00;
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::reserve(&this->begin_nodes_,0x2000);
  std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::reserve(&this->end_nodes_,0x2000);
  return;
}

Assistant:

LatticeImpl::LatticeImpl(const Writer *writer)
    : sentence_(0), size_(0), theta_(kDefaultTheta), Z_(0.0),
      request_type_(MECAB_ONE_BEST),
      writer_(writer),
      ostrs_(0),
      allocator_(new Allocator<Node, Path>) {
  begin_nodes_.reserve(MIN_INPUT_BUFFER_SIZE);
  end_nodes_.reserve(MIN_INPUT_BUFFER_SIZE);
}